

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_Dialog.cxx
# Opt level: O0

void __thiscall Fl_Help_Dialog::cb_back__i(Fl_Help_Dialog *this,Fl_Button *param_1,void *param_2)

{
  int top;
  int iVar1;
  char *__s1;
  int l;
  void *param_2_local;
  Fl_Button *param_1_local;
  Fl_Help_Dialog *this_local;
  
  if (0 < this->index_) {
    this->index_ = this->index_ + -1;
  }
  if (this->index_ == 0) {
    Fl_Widget::deactivate(&this->back_->super_Fl_Widget);
  }
  Fl_Widget::activate(&this->forward_->super_Fl_Widget);
  top = this->line_[this->index_];
  __s1 = Fl_Help_View::filename(this->view_);
  iVar1 = strcmp(__s1,this->file_[this->index_]);
  if (iVar1 != 0) {
    Fl_Help_View::load(this->view_,this->file_[this->index_]);
  }
  Fl_Help_View::topline(this->view_,top);
  return;
}

Assistant:

void Fl_Help_Dialog::cb_back__i(Fl_Button*, void*) {
  if (index_ > 0)
  index_ --;

if (index_ == 0)
  back_->deactivate();

forward_->activate();

int l = line_[index_];

if (strcmp(view_->filename(), file_[index_]) != 0)
  view_->load(file_[index_]);

view_->topline(l);
}